

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

int test_relprod(void)

{
  BDD BVar1;
  BDD BVar2;
  uint8_t local_a5 [45];
  BDD local_78;
  BDD ones;
  BDD zeroes;
  BDD prev;
  BDD next;
  BDD t;
  BDD s;
  BDDSET all_vars_set;
  BDDSET vars_set;
  BDDVAR all_vars [6];
  uint32_t local_18 [2];
  BDDVAR vars [3];
  
  local_18[0] = 0;
  local_18[1] = 2;
  vars[0] = 4;
  vars_set = 0x100000000;
  all_vars[0] = 2;
  all_vars[1] = 3;
  all_vars[2] = 4;
  all_vars[3] = 5;
  all_vars_set = mtbdd_set_from_array(local_18,3);
  s = mtbdd_set_from_array((uint32_t *)&vars_set,6);
  next = 0;
  local_a5[0x27] = 0;
  local_a5[0x28] = 1;
  local_a5[0x29] = 0;
  local_a5[0x2a] = 1;
  local_a5[0x2b] = 0;
  local_a5[0x2c] = 1;
  next = sylvan_union_cube_RUN(0,s,local_a5 + 0x27);
  local_a5[0x21] = 1;
  local_a5[0x22] = 0;
  local_a5[0x23] = 2;
  local_a5[0x24] = 0;
  local_a5[0x25] = 2;
  local_a5[0x26] = 0;
  next = sylvan_union_cube_RUN(next,s,local_a5 + 0x21);
  local_a5[0x1b] = 2;
  local_a5[0x1c] = 0;
  local_a5[0x1d] = 1;
  local_a5[0x1e] = 0;
  local_a5[0x1f] = 2;
  local_a5[0x20] = 0;
  next = sylvan_union_cube_RUN(next,s,local_a5 + 0x1b);
  local_a5[0x15] = 2;
  local_a5[0x16] = 0;
  local_a5[0x17] = 2;
  local_a5[0x18] = 0;
  local_a5[0x19] = 1;
  local_a5[0x1a] = 0;
  next = sylvan_union_cube_RUN(next,s,local_a5 + 0x15);
  local_a5[0x12] = 0;
  local_a5[0x13] = 0;
  local_a5[0x14] = 1;
  t = sylvan_cube(all_vars_set,local_a5 + 0x12);
  local_a5[0xf] = 0;
  local_a5[0x10] = 0;
  local_a5[0x11] = 0;
  ones = sylvan_cube(all_vars_set,local_a5 + 0xf);
  local_a5[0xc] = 1;
  local_a5[0xd] = 1;
  local_a5[0xe] = 1;
  local_78 = sylvan_cube(all_vars_set,local_a5 + 0xc);
  prev = sylvan_relnext_RUN(t,next,s,0);
  BVar1 = sylvan_relprev_RUN(next,prev,s,0);
  zeroes = BVar1;
  if (prev == ones) {
    BVar2 = sylvan_not(ones);
    if (BVar1 == BVar2) {
      prev = sylvan_relnext_RUN(prev,next,s,0);
      zeroes = sylvan_relprev_RUN(next,prev,s,0);
      if (prev == local_78) {
        if (zeroes == ones) {
          local_a5[6] = 0;
          local_a5[7] = 0;
          local_a5[8] = 0;
          local_a5[9] = 0;
          local_a5[10] = 0;
          local_a5[0xb] = 1;
          next = sylvan_cube(s,local_a5 + 6);
          BVar2 = sylvan_relprev_RUN(next,t,s,0);
          BVar1 = next;
          if (BVar2 == ones) {
            BVar2 = sylvan_not(t);
            BVar1 = sylvan_relprev_RUN(BVar1,BVar2,s,0);
            if (BVar1 == 0) {
              BVar1 = sylvan_relnext_RUN(t,next,s,0);
              if (BVar1 == 0) {
                BVar1 = sylvan_relnext_RUN(ones,next,s,0);
                if (BVar1 == t) {
                  local_a5[0] = '\0';
                  local_a5[1] = 0;
                  local_a5[2] = 0;
                  local_a5[3] = 0;
                  local_a5[4] = 0;
                  local_a5[5] = 2;
                  next = sylvan_cube(s,local_a5);
                  BVar1 = sylvan_relprev_RUN(next,t,s,0);
                  if (BVar1 == ones) {
                    BVar1 = sylvan_relprev_RUN(next,ones,s,0);
                    if (BVar1 == ones) {
                      BVar1 = sylvan_not(ones);
                      BVar1 = sylvan_relnext_RUN(BVar1,next,s,0);
                      if (BVar1 == 0) {
                        vars[1] = 0;
                      }
                      else {
                        fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                ,399,"int test_relprod()",
                                "sylvan_relnext(sylvan_not(zeroes), t, all_vars_set) == sylvan_false"
                               );
                        vars[1] = 1;
                      }
                    }
                    else {
                      fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                              ,0x18e,"int test_relprod()",
                              "sylvan_relprev(t, zeroes, all_vars_set) == zeroes");
                      vars[1] = 1;
                    }
                  }
                  else {
                    fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                            ,0x18d,"int test_relprod()",
                            "sylvan_relprev(t, s, all_vars_set) == zeroes");
                    vars[1] = 1;
                  }
                }
                else {
                  fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                          ,0x18a,"int test_relprod()","sylvan_relnext(zeroes, t, all_vars_set) == s"
                         );
                  vars[1] = 1;
                }
              }
              else {
                fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                        ,0x189,"int test_relprod()",
                        "sylvan_relnext(s, t, all_vars_set) == sylvan_false");
                vars[1] = 1;
              }
            }
            else {
              fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                      ,0x188,"int test_relprod()",
                      "sylvan_relprev(t, sylvan_not(s), all_vars_set) == sylvan_false");
              vars[1] = 1;
            }
          }
          else {
            fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                    ,0x187,"int test_relprod()","sylvan_relprev(t, s, all_vars_set) == zeroes");
            vars[1] = 1;
          }
        }
        else {
          fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                  ,0x184,"int test_relprod()","prev == zeroes");
          vars[1] = 1;
        }
      }
      else {
        fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                ,0x183,"int test_relprod()","next == ones");
        vars[1] = 1;
      }
    }
    else {
      fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
              ,0x17f,"int test_relprod()","prev == sylvan_not(zeroes)");
      vars[1] = 1;
    }
  }
  else {
    fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
            "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c",
            0x17e,"int test_relprod()","next == zeroes");
    vars[1] = 1;
  }
  return vars[1];
}

Assistant:

int
test_relprod()
{
    BDDVAR vars[] = {0,2,4};
    BDDVAR all_vars[] = {0,1,2,3,4,5};

    BDDSET vars_set = sylvan_set_fromarray(vars, 3);
    BDDSET all_vars_set = sylvan_set_fromarray(all_vars, 6);

    BDD s, t, next, prev;
    BDD zeroes, ones;

    // transition relation: 000 --> 111 and !000 --> 000
    t = sylvan_false;
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){0,1,0,1,0,1}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){1,0,2,0,2,0}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){2,0,1,0,2,0}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){2,0,2,0,1,0}));

    s = sylvan_cube(vars_set, (uint8_t[]){0,0,1});
    zeroes = sylvan_cube(vars_set, (uint8_t[]){0,0,0});
    ones = sylvan_cube(vars_set, (uint8_t[]){1,1,1});

    next = sylvan_relnext(s, t, all_vars_set);
    prev = sylvan_relprev(t, next, all_vars_set);
    test_assert(next == zeroes);
    test_assert(prev == sylvan_not(zeroes));

    next = sylvan_relnext(next, t, all_vars_set);
    prev = sylvan_relprev(t, next, all_vars_set);
    test_assert(next == ones);
    test_assert(prev == zeroes);

    t = sylvan_cube(all_vars_set, (uint8_t[]){0,0,0,0,0,1});
    test_assert(sylvan_relprev(t, s, all_vars_set) == zeroes);
    test_assert(sylvan_relprev(t, sylvan_not(s), all_vars_set) == sylvan_false);
    test_assert(sylvan_relnext(s, t, all_vars_set) == sylvan_false);
    test_assert(sylvan_relnext(zeroes, t, all_vars_set) == s);

    t = sylvan_cube(all_vars_set, (uint8_t[]){0,0,0,0,0,2});
    test_assert(sylvan_relprev(t, s, all_vars_set) == zeroes);
    test_assert(sylvan_relprev(t, zeroes, all_vars_set) == zeroes);
    test_assert(sylvan_relnext(sylvan_not(zeroes), t, all_vars_set) == sylvan_false);

    return 0;
}